

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O0

void rescan_config(void)

{
  char **ppcVar1;
  UT_icd *pUVar2;
  uint uVar3;
  ctor_f *pcVar4;
  bool bVar5;
  UT_array *jobs;
  int iVar6;
  UT_string *em_00;
  char *pcVar7;
  UT_array *__s;
  job_t *b;
  char *local_170;
  uint local_15c;
  char *local_158;
  ulong local_150;
  ulong local_138;
  char *local_128;
  char *local_120;
  ulong local_118;
  ulong local_100;
  ulong local_e0;
  ulong local_c8;
  char *local_b8;
  ulong local_b0;
  ulong local_98;
  job_t *local_88;
  ulong local_80;
  ulong local_68;
  job_t *local_58;
  job_t *local_50;
  ulong local_48;
  size_t _ut_i_1;
  size_t _ut_i;
  UT_array *new_jobs;
  UT_array *previous_jobs;
  UT_string *em;
  char *pcStack_18;
  int c;
  job_t *old;
  job_t *job;
  
  syslog(6,"rescanning job configuration");
  em_00 = (UT_string *)calloc(0x18,1);
  if (em_00 == (UT_string *)0x0) {
    exit(-1);
  }
  em_00->n = 0;
  em_00->i = 0;
  em_00->d = (char *)0x0;
  if (em_00->n - em_00->i < 100) {
    pcVar7 = (char *)realloc(em_00->d,em_00->n + 100);
    em_00->d = pcVar7;
    if (em_00->d == (char *)0x0) {
      exit(-1);
    }
    em_00->n = em_00->n + 100;
  }
  *em_00->d = '\0';
  jobs = cfg.jobs;
  __s = (UT_array *)malloc(0x30);
  memset(__s,0,0x30);
  (__s->icd).sz = 0x218;
  (__s->icd).init = job_ini;
  (__s->icd).copy = job_cpy;
  (__s->icd).dtor = job_fin;
  cfg.jobs = __s;
  close_sockets(&cfg);
  iVar6 = parse_jobs(&cfg,em_00);
  if (iVar6 == -1) {
    syslog(2,"FAILED to parse %s",cfg.file);
    syslog(2,"ERROR: %s",em_00->d);
    syslog(2,"NOTE: using PREVIOUS job config");
    cfg.jobs = jobs;
  }
  else {
    old = (job_t *)0x0;
    while( true ) {
      if (old == (job_t *)0x0) {
        if (__s->i == 0) {
          local_50 = (job_t *)0x0;
        }
        else {
          local_50 = (job_t *)__s->d;
        }
        local_58 = local_50;
      }
      else {
        if (old < (job_t *)__s->d) {
          local_68 = 0xffffffffffffffff;
        }
        else {
          local_68 = (ulong)((long)old - (long)__s->d) / (__s->icd).sz;
        }
        if (local_68 + 1 < (ulong)__s->i) {
          if (old < (job_t *)__s->d) {
            local_80 = 0xffffffffffffffff;
          }
          else {
            local_80 = (ulong)((long)old - (long)__s->d) / (__s->icd).sz;
          }
          local_88 = (job_t *)(__s->d + (__s->icd).sz * (local_80 + 1));
        }
        else {
          local_88 = (job_t *)0x0;
        }
        local_58 = local_88;
      }
      old = local_58;
      if (local_58 == (job_t *)0x0) break;
      b = get_job_by_name(jobs,local_58->name);
      if (b != (job_t *)0x0) {
        iVar6 = job_cmp(local_58,b);
        if (iVar6 == 0) {
          job_fin(local_58);
          job_cpy(local_58,b);
        }
        else {
          local_58->start_ts = b->start_ts;
          local_58->pid = b->pid;
          if (local_58->pid != 0) {
            local_58->terminate = 1;
          }
        }
        if ((jobs->icd).dtor != (undefined1 *)0x0) {
          bVar5 = false;
          while (!bVar5) {
            if (b < (job_t *)jobs->d) {
              local_98 = 0xffffffffffffffff;
            }
            else {
              local_98 = (ulong)((long)b - (long)jobs->d) / (jobs->icd).sz;
            }
            if (local_98 < jobs->i) {
              if (b < (job_t *)jobs->d) {
                local_b0 = 0xffffffffffffffff;
              }
              else {
                local_b0 = (ulong)((long)b - (long)jobs->d) / (jobs->icd).sz;
              }
              local_b8 = jobs->d + (jobs->icd).sz * local_b0;
            }
            else {
              local_b8 = (char *)0x0;
            }
            (*(code *)(jobs->icd).dtor)(local_b8);
            bVar5 = true;
          }
        }
        if (b < (job_t *)jobs->d) {
          local_c8 = 0xffffffffffffffff;
        }
        else {
          local_c8 = (ulong)((long)b - (long)jobs->d) / (jobs->icd).sz;
        }
        if (local_c8 + 1 < (ulong)jobs->i) {
          if (b < (job_t *)jobs->d) {
            local_e0 = 0xffffffffffffffff;
          }
          else {
            local_e0 = (ulong)((long)b - (long)jobs->d) / (jobs->icd).sz;
          }
          if (b < (job_t *)jobs->d) {
            local_100 = 0xffffffffffffffff;
          }
          else {
            local_100 = (ulong)((long)b - (long)jobs->d) / (jobs->icd).sz;
          }
          if (b < (job_t *)jobs->d) {
            local_118 = 0xffffffffffffffff;
          }
          else {
            local_118 = (ulong)((long)b - (long)jobs->d) / (jobs->icd).sz;
          }
          memmove(jobs->d + (jobs->icd).sz * local_e0,jobs->d + (jobs->icd).sz * (local_100 + 1),
                  ((ulong)jobs->i - (local_118 + 1)) * (jobs->icd).sz);
        }
        jobs->i = jobs->i - 1;
      }
    }
    pcStack_18 = (char *)0x0;
    while( true ) {
      if (pcStack_18 == (char *)0x0) {
        if (jobs->i == 0) {
          local_120 = (char *)0x0;
        }
        else {
          local_120 = jobs->d;
        }
        local_128 = local_120;
      }
      else {
        if (pcStack_18 < jobs->d) {
          local_138 = 0xffffffffffffffff;
        }
        else {
          local_138 = (ulong)((long)pcStack_18 - (long)jobs->d) / (jobs->icd).sz;
        }
        if (local_138 + 1 < (ulong)jobs->i) {
          if (pcStack_18 < jobs->d) {
            local_150 = 0xffffffffffffffff;
          }
          else {
            local_150 = (ulong)((long)pcStack_18 - (long)jobs->d) / (jobs->icd).sz;
          }
          local_158 = jobs->d + (jobs->icd).sz * (local_150 + 1);
        }
        else {
          local_158 = (char *)0x0;
        }
        local_128 = local_158;
      }
      pcStack_18 = local_128;
      if (local_128 == (char *)0x0) break;
      if (*(int *)(local_128 + 0xf0) != 0) {
        pcStack_18[0x108] = '\x01';
        pcStack_18[0x109] = '\0';
        pcStack_18[0x10a] = '\0';
        pcStack_18[0x10b] = '\0';
        pcStack_18[0x10c] = '\0';
        pcStack_18[0x10d] = '\0';
        pcStack_18[0x10e] = '\0';
        pcStack_18[0x10f] = '\0';
        pcStack_18[0x174] = '\0';
        pcStack_18[0x175] = '\0';
        pcStack_18[0x176] = '\0';
        pcStack_18[0x177] = '\0';
        pcStack_18[0x178] = '\x01';
        pcStack_18[0x179] = '\0';
        pcStack_18[0x17a] = '\0';
        pcStack_18[0x17b] = '\0';
        em_00->i = 0;
        *em_00->d = '\0';
        utstring_printf(em_00,"%s(deleted)",*(undefined8 *)local_128);
        free(*(void **)local_128);
        pcVar7 = strdup(em_00->d);
        *(char **)local_128 = pcVar7;
        if ((cfg.jobs)->n < (cfg.jobs)->i + 1) {
          while ((cfg.jobs)->n < (cfg.jobs)->i + 1) {
            if ((cfg.jobs)->n == 0) {
              local_15c = 8;
            }
            else {
              local_15c = (cfg.jobs)->n << 1;
            }
            (cfg.jobs)->n = local_15c;
          }
          pcVar7 = (char *)realloc((cfg.jobs)->d,(ulong)(cfg.jobs)->n * ((cfg.jobs)->icd).sz);
          (cfg.jobs)->d = pcVar7;
          if (pcVar7 == (char *)0x0) {
            exit(-1);
          }
        }
        if (((cfg.jobs)->icd).copy == (ctor_f *)0x0) {
          ppcVar1 = &(cfg.jobs)->d;
          pUVar2 = &(cfg.jobs)->icd;
          uVar3 = (cfg.jobs)->i;
          (cfg.jobs)->i = uVar3 + 1;
          memcpy(*ppcVar1 + pUVar2->sz * (ulong)uVar3,local_128,((cfg.jobs)->icd).sz);
        }
        else {
          pcVar4 = ((cfg.jobs)->icd).copy;
          ppcVar1 = &(cfg.jobs)->d;
          pUVar2 = &(cfg.jobs)->icd;
          uVar3 = (cfg.jobs)->i;
          (cfg.jobs)->i = uVar3 + 1;
          (*pcVar4)(*ppcVar1 + pUVar2->sz * (ulong)uVar3,local_128);
        }
      }
    }
    if (jobs->n != 0) {
      if ((jobs->icd).dtor != (undefined1 *)0x0) {
        for (local_48 = 0; local_48 < jobs->i; local_48 = local_48 + 1) {
          if (local_48 < jobs->i) {
            local_170 = jobs->d + (jobs->icd).sz * local_48;
          }
          else {
            local_170 = (char *)0x0;
          }
          (*(code *)(jobs->icd).dtor)(local_170);
        }
      }
      free(jobs->d);
    }
    jobs->n = 0;
    free(jobs);
  }
  if (em_00->d != (char *)0x0) {
    free(em_00->d);
  }
  em_00->n = 0;
  free(em_00);
  return;
}

Assistant:

void rescan_config(void) {
  job_t *job, *old;
  int c;

  syslog(LOG_INFO,"rescanning job configuration");
  UT_string *em; utstring_new(em);
  UT_array *previous_jobs = cfg.jobs;
  UT_array *new_jobs; utarray_new(new_jobs, &job_mm); cfg.jobs = new_jobs;

  /* udp sockets get re-opened during config parsing */
  close_sockets(&cfg); 

  if (parse_jobs(&cfg, em) == -1) {
    syslog(LOG_CRIT,"FAILED to parse %s", cfg.file);
    syslog(LOG_CRIT,"ERROR: %s", utstring_body(em));
    syslog(LOG_CRIT,"NOTE: using PREVIOUS job config");
    cfg.jobs = previous_jobs;
    goto done;
  }

  /* parse succeeded. diff the new jobs vs. existing jobs */
  job=NULL;
  while( (job = (job_t*)utarray_next(new_jobs,job))) {
    old = get_job_by_name(previous_jobs, job->name);
    if (!old) continue;          // new job definition; startup forthcoming.
    c = job_cmp(job,old);        
    if (c == 0) {                // new job with same name and identical to old:
      job_fin(job);              // free up new job,
      job_cpy(job,old);          // and copy old job into new to retain pid etc.
    } else {                     // new job with same name, but new config:
      job->start_ts = old->start_ts;
      job->pid = old->pid;
      if (job->pid) job->terminate=1;// induce reset to pick up new settings.
    }
    utarray_erase(previous_jobs, utarray_eltidx(previous_jobs,old), 1);
  }
  /* any jobs left in previous_jobs are no longer in the new configuration */
  old=NULL;
  while ( (old=(job_t*)utarray_next(previous_jobs,old))) {
    if (old->pid == 0) continue; /* not running. free it below. */
    /* terminate old job, but keep a record of it til it exits */
    old->terminate=1;
    old->respawn=0;
    old->delete_when_collected=1;
    utstring_clear(em); utstring_printf(em, "%s(deleted)", old->name);
    free(old->name); old->name = strdup(utstring_body(em));
    utarray_push_back(cfg.jobs, old); 
  }
  utarray_free(previous_jobs);

 done:
  utstring_free(em);
}